

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsCoreMakeConnections(HelicsCore core,char *file,HelicsError *err)

{
  Core *pCVar1;
  size_t sVar2;
  long *local_40 [2];
  long local_30 [2];
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    local_40[0] = local_30;
    if (file == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(file);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,file,file + sVar2);
    }
    (*pCVar1->_vptr_Core[0x46])(pCVar1,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void helicsCoreMakeConnections(HelicsCore core, const char* file, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->makeConnections(AS_STRING(file));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}